

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O1

int32_t wal_get_type(uchar *buffer)

{
  uchar uVar1;
  int iVar2;
  int32_t iVar3;
  long lVar4;
  bool bVar5;
  
  uVar1 = *buffer;
  if (uVar1 == '\x03') {
    lVar4 = 0;
    do {
      uVar1 = buffer[lVar4 + 4];
      bVar5 = (byte)(uVar1 + 0x81) < 0xa1;
      if (uVar1 != '\0' && bVar5) break;
      iVar2 = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (iVar2 != 0x1f);
    if (uVar1 != '\0' && bVar5) {
      return 0;
    }
    lVar4 = 0;
    do {
      bVar5 = buffer[lVar4 + 0x50] != '\0' && (byte)(buffer[lVar4 + 0x50] + 0x81) < 0xa1;
      if (bVar5) break;
      iVar2 = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (iVar2 != 0x1f);
    iVar3 = 2;
  }
  else {
    if (uVar1 != '\0' && 0x5e < (byte)(uVar1 - 0x20)) {
      return 0;
    }
    lVar4 = 0;
    do {
      uVar1 = buffer[lVar4];
      bVar5 = (byte)(uVar1 + 0x81) < 0xa1;
      if (uVar1 != '\0' && bVar5) break;
      iVar2 = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (iVar2 != 0x1f);
    if (uVar1 != '\0' && bVar5) {
      return 0;
    }
    lVar4 = 0;
    do {
      bVar5 = buffer[lVar4 + 0x38] != '\0' && (byte)(buffer[lVar4 + 0x38] + 0x81) < 0xa1;
      if (bVar5) break;
      iVar2 = (int)lVar4;
      lVar4 = lVar4 + 1;
    } while (iVar2 != 0x1f);
    iVar3 = 1;
  }
  if (bVar5) {
    return 0;
  }
  return iVar3;
}

Assistant:

int32_t wal_get_type(const unsigned char *buffer)
{
	uint8_t version = (uint8_t)(*buffer);
	if (version == 3) {
		goto possibly_daikatana;
	} else if (is_printable(version) || (version == 0)) {
		goto possibly_quake2;
	}
	goto not_a_wal;

possibly_daikatana:
	if (invalid_name(buffer + offsetof(struct wal_dk_header, name), 0) ||
		invalid_name(buffer + offsetof(struct wal_dk_header, animname), 0)) {
		goto not_a_wal;
	}
	return WAL_TYPE_DAIKATANA;
possibly_quake2:
	if (invalid_name(buffer + offsetof(struct wal_q2_header, name), 0) ||
		invalid_name(buffer + offsetof(struct wal_q2_header, animname), 0)) {
		goto not_a_wal;
	}
	return WAL_TYPE_QUAKE2;
not_a_wal:
	return WAL_NOT_A_WAL;
}